

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_input.cpp
# Opt level: O1

void Am_Handle_Event_Received(XEvent *event_return)

{
  uint uVar1;
  uint uVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  Am_Drawonable_Impl *draw;
  size_t sVar5;
  ostream *poVar6;
  Time TVar7;
  undefined8 *puVar8;
  Am_Button_Down down;
  undefined8 uVar9;
  uint uVar10;
  short code;
  uint uVar11;
  Am_Input_Event_Handlers *pAVar12;
  Screen_Desc *screen;
  Am_Input_Char ic;
  int left;
  int top;
  int outer_top;
  int outer_left;
  int bottom;
  int right;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  int local_4c;
  uint local_48;
  uint local_44;
  undefined1 local_40 [4];
  undefined1 local_3c [4];
  undefined4 local_38;
  undefined4 local_34;
  
  draw = Get_Drawable_Backpointer((event_return->xany).display,(event_return->xany).window);
  if (draw == (Am_Drawonable_Impl *)0x0) {
    if (Am_Debug_Print_Input_Events == 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"<> Input ignored because no drawonable\n",0x27);
    std::ostream::flush();
    return;
  }
  if (draw->ext_handler != (Am_External_Event_Handler *)0x0) {
    (*draw->ext_handler)(event_return);
  }
  pAVar12 = draw->event_handlers;
  Am_Input_Char::Am_Input_Char(&local_54,0,false,false,false,Am_NEITHER,Am_NOT_MOUSE,false);
  if (pAVar12 == (Am_Input_Event_Handlers *)0x0) {
    if (Am_Debug_Print_Input_Events == 0) {
      return;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"<> Input ignored for ",0x15);
    poVar6 = operator<<((ostream *)&std::cout,&draw->super_Am_Drawonable);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," because no Event_Handler\n",0x1a);
LAB_0027b4bb:
    std::ostream::flush();
    return;
  }
  switch(event_return->type) {
  case 2:
    local_50 = create_input_char_from_key(&event_return->xkey,draw->screen->display);
    Am_Input_Char::operator=(&local_54,&local_50);
    if (local_54.code == 0) {
      return;
    }
    goto LAB_0027b6dd;
  case 3:
  case 9:
  case 10:
  case 0xb:
  case 0xf:
  case 0x14:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x20:
  case 0x22:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"** Received event of unexpected type: ",0x26);
    __s = event_names[event_return->type];
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    goto LAB_0027b4bb;
  case 4:
    uVar11 = (event_return->xkey).keycode;
    uVar10 = (event_return->xkey).state;
    TVar7 = (event_return->xkey).time;
    screen = draw->screen;
    down = Am_BUTTON_DOWN;
    goto LAB_0027b6c1;
  case 5:
    uVar11 = (event_return->xkey).keycode;
    uVar10 = (event_return->xkey).state;
    TVar7 = (event_return->xkey).time;
    screen = draw->screen;
    down = Am_BUTTON_UP;
LAB_0027b6c1:
    local_50 = create_input_char_from_mouse(uVar11,uVar10,down,TVar7,screen);
    Am_Input_Char::operator=(&local_54,&local_50);
LAB_0027b6dd:
    bVar3 = exit_if_stop_char((Am_Input_Char)0x0);
    if (bVar3) {
      return;
    }
    Am_Input_Event::Set(Am_Current_Input_Event,local_54,(event_return->xkey).x,
                        (event_return->xkey).y,(event_return->xkey).time,&draw->super_Am_Drawonable)
    ;
    pAVar12 = draw->event_handlers;
    goto LAB_0027b7f0;
  case 6:
    uVar11 = (event_return->xkey).state;
    code = 0x103;
    goto LAB_0027b7a6;
  case 7:
    uVar11 = (event_return->xcrossing).state;
    code = 0x104;
    goto LAB_0027b7a6;
  case 8:
    uVar11 = (event_return->xcrossing).state;
    code = 0x105;
LAB_0027b7a6:
    local_50 = create_input_char_from_code(code,uVar11,Am_NEITHER,Am_SINGLE_CLICK);
    Am_Input_Char::operator=(&local_54,&local_50);
    Am_Input_Event::Set(Am_Current_Input_Event,local_54,(event_return->xkey).x,
                        (event_return->xkey).y,(event_return->xkey).time,&draw->super_Am_Drawonable)
    ;
    pAVar12 = draw->event_handlers;
LAB_0027b7f0:
    (**(code **)(*(long *)pAVar12 + 0x28))(pAVar12,draw,Am_Current_Input_Event);
    break;
  case 0xc:
    if (Am_Debug_Print_Input_Events != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<> Exposure Event, x=",0x15);
      poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(event_return->xfocus).mode);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," y=",3);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(event_return->xfocus).detail);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," width=",7);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(event_return->xexpose).width);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," height=",8);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(event_return->xexpose).height);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," drawonable=",0xc);
      poVar6 = operator<<(poVar6,&draw->super_Am_Drawonable);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    (**(code **)(*(long *)draw->event_handlers + 0x20))
              (draw->event_handlers,draw,(event_return->xfocus).mode,(event_return->xfocus).detail,
               (event_return->xexpose).width,(event_return->xexpose).height);
    break;
  case 0x11:
    if (Am_Debug_Print_Input_Events != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<> DestroyNotify, drawonable=",0x1d);
      poVar6 = operator<<((ostream *)&std::cout,&draw->super_Am_Drawonable);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    goto LAB_0027b770;
  case 0x12:
    if (Am_Debug_Print_Input_Events != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<> UnmapNotify, drawonable=",0x1b);
      poVar6 = operator<<((ostream *)&std::cout,&draw->super_Am_Drawonable);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    if (draw->expect_map_change != true) {
      (draw->super_Am_Drawonable).iconified = true;
      pAVar12 = draw->event_handlers;
      puVar8 = *(undefined8 **)pAVar12;
      uVar9 = 1;
LAB_0027ba2a:
      (*(code *)*puVar8)(pAVar12,draw,uVar9);
      return;
    }
    goto LAB_0027b89d;
  case 0x13:
    if (Am_Debug_Print_Input_Events != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<> MapNotify, drawonable=",0x19);
      poVar6 = operator<<((ostream *)&std::cout,&draw->super_Am_Drawonable);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    if (draw->expect_map_change != true) {
      (draw->super_Am_Drawonable).iconified = false;
      pAVar12 = draw->event_handlers;
      puVar8 = *(undefined8 **)pAVar12;
      uVar9 = 0;
      goto LAB_0027ba2a;
    }
LAB_0027b89d:
    draw->expect_map_change = false;
    break;
  case 0x15:
    if (Am_Debug_Print_Input_Events != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"<> ReparentNotify, drawonable=",0x1e);
      poVar6 = operator<<((ostream *)&std::cout,&draw->super_Am_Drawonable);
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    (*(draw->super_Am_Drawonable)._vptr_Am_Drawonable[4])
              (draw,&local_50,&local_4c,&local_34,&local_38,local_3c,local_40);
    (**(code **)(*(long *)draw->event_handlers + 8))
              (draw->event_handlers,draw,local_50,local_4c,local_34,local_38);
    break;
  case 0x16:
    iVar4 = (*(draw->super_Am_Drawonable)._vptr_Am_Drawonable[4])
                      (draw,&local_34,&local_38,local_3c,local_40,&local_50,&local_4c);
    if ((char)iVar4 != '\0') {
      uVar1 = (event_return->xexpose).count;
      uVar2 = (event_return->xgraphicsexpose).major_code;
      uVar11 = (draw->super_Am_Drawonable).width;
      uVar10 = (draw->super_Am_Drawonable).height;
      if (uVar2 != uVar10 ||
          (uVar1 != uVar11 ||
          ((draw->super_Am_Drawonable).top != local_4c ||
          (Am_Input_Char)(draw->super_Am_Drawonable).left != local_50))) {
        if (Am_Debug_Print_Input_Events != 0) {
          local_48 = uVar2;
          local_44 = uVar1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"<> Configure Notify, x=",0x17);
          poVar6 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_50);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," y=",3);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_4c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," width=",7);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," height=",8);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," drawonable=",0xc);
          poVar6 = operator<<(poVar6,&draw->super_Am_Drawonable);
          std::endl<char,std::char_traits<char>>(poVar6);
          uVar1 = local_44;
          uVar2 = local_48;
        }
        (draw->super_Am_Drawonable).left = (int)local_50;
        (draw->super_Am_Drawonable).top = local_4c;
        (draw->super_Am_Drawonable).width = uVar1;
        (draw->super_Am_Drawonable).height = uVar2;
        (**(code **)(*(long *)draw->event_handlers + 0x18))
                  (draw->event_handlers,draw,local_50,local_4c);
      }
    }
    break;
  case 0x1e:
    handle_selection_request(event_return,draw);
    break;
  case 0x21:
    TVar7 = XInternAtom((event_return->xany).display,"WM_DELETE_WINDOW",0);
    if ((event_return->xkey).time != TVar7) {
      return;
    }
LAB_0027b770:
    (**(code **)(*(long *)draw->event_handlers + 0x10))(draw->event_handlers,draw);
  }
  return;
}

Assistant:

void
Am_Handle_Event_Received(XEvent &event_return)
{
  Am_Drawonable_Impl *draw = Get_Drawable_Backpointer(event_return.xany.display,
                                                      event_return.xany.window);
  if (!draw) {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Input ignored because no drawonable\n" << std::flush;
    return;
  }
  if (draw->ext_handler) {
    //call the external handler IN ADDITION to local handlers
    draw->ext_handler(&event_return);
  }

  Am_Input_Event_Handlers *evh = draw->event_handlers;
  Am_Input_Char ic;

  if (!evh) {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Input ignored for " << draw
                << " because no Event_Handler\n"
                << std::flush;
    return;
  }

  switch (event_return.xany.type) {
  case KeyPress:
    //ic = create_input_char_from_key (event_return.xkey.keycode,
    //				 event_return.xkey.state,
    //				 draw->screen->display);
    ic = create_input_char_from_key(event_return.xkey, draw->screen->display);
    if (ic.code != 0) { // then is a legal code
      if (exit_if_stop_char(ic))
        return;
      set_input_event(Am_Current_Input_Event, ic, event_return.xkey.x,
                      event_return.xkey.y, event_return.xkey.time, draw);
      draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    }
    break;
  case ButtonPress:
    ic = create_input_char_from_mouse(
        event_return.xbutton.button, event_return.xbutton.state, Am_BUTTON_DOWN,
        event_return.xbutton.time, draw->screen);
    if (exit_if_stop_char(ic))
      return;
    set_input_event(Am_Current_Input_Event, ic, event_return.xbutton.x,
                    event_return.xbutton.y, event_return.xbutton.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case ButtonRelease:
    ic = create_input_char_from_mouse(event_return.xbutton.button,
                                      event_return.xbutton.state, Am_BUTTON_UP,
                                      event_return.xbutton.time, draw->screen);
    if (exit_if_stop_char(ic))
      return;
    set_input_event(Am_Current_Input_Event, ic, event_return.xbutton.x,
                    event_return.xbutton.y, event_return.xbutton.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case MotionNotify:
    ic = create_input_char_from_code(Am_MOUSE_MOVED, event_return.xmotion.state,
                                     Am_NEITHER, Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xmotion.x,
                    event_return.xmotion.y, event_return.xmotion.time, draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case EnterNotify:
    ic = create_input_char_from_code(Am_MOUSE_ENTER_WINDOW,
                                     event_return.xcrossing.state, Am_NEITHER,
                                     Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xcrossing.x,
                    event_return.xcrossing.y, event_return.xcrossing.time,
                    draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case LeaveNotify:
    ic = create_input_char_from_code(Am_MOUSE_LEAVE_WINDOW,
                                     event_return.xcrossing.state, Am_NEITHER,
                                     Am_SINGLE_CLICK);
    set_input_event(Am_Current_Input_Event, ic, event_return.xcrossing.x,
                    event_return.xcrossing.y, event_return.xcrossing.time,
                    draw);
    draw->event_handlers->Input_Event_Notify(draw, Am_Current_Input_Event);
    break;
  case Expose:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> Exposure Event, x=" << event_return.xexpose.x
                << " y=" << event_return.xexpose.y
                << " width=" << event_return.xexpose.width
                << " height=" << event_return.xexpose.height
                << " drawonable=" << draw << std::endl;
    draw->event_handlers->Exposure_Notify(
        draw,
        //					      event_return.xexpose.count,
        event_return.xexpose.x, event_return.xexpose.y,
        event_return.xexpose.width, event_return.xexpose.height);
    break;
  case DestroyNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> DestroyNotify, drawonable=" << draw << std::endl;
    draw->event_handlers->Destroy_Notify(draw);
    break;
  //// BUG: Not used
  // cases UnmapNotify and MapNotify were commented out
  // EAB: there does not appear to be a way to distinguish internally-generated
  // map/unmap requests from user-generated iconify/deiconify requests
  case UnmapNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> UnmapNotify, drawonable=" << draw << std::endl;
    //	draw->event_handlers->Unmap_Notify(draw);
    if (draw->expect_map_change) {
      draw->expect_map_change = false;
    } else {
      draw->iconify_notify(true);
      draw->event_handlers->Iconify_Notify(draw, true);
    }
    break;
  case MapNotify:
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> MapNotify, drawonable=" << draw << std::endl;
    //	  draw->event_handlers->Map_Notify(draw, false);
    if (draw->expect_map_change) {
      draw->expect_map_change = false;
    } else {
      draw->iconify_notify(false);
      draw->event_handlers->Iconify_Notify(draw, false);
    }
    break;
  case ReparentNotify: {
    if (Am_Debug_Print_Input_Events)
      std::cout << "<> ReparentNotify, drawonable=" << draw << std::endl;
    int left, top, right, bottom, outer_left, outer_top;
    draw->Inquire_Window_Borders(left, top, right, bottom, outer_left,
                                 outer_top);
    draw->event_handlers->Frame_Resize_Notify(draw, left, top, right, bottom);
    break;
  }
  case ConfigureNotify: {
    // Configure events may come in for windows that haven't really
    // changed size or position, and in this case the events are ignored
    // (i.e., Gem does not pass them on to the user's event-handler).
    // For example, a 'valid' configure event may be perceived and
    // dispatched that causes the user's ConfigureNotify Event Handler
    // to set the size of the window, which in turn generates a 'bogus'
    // configure event.  When the bogus event is perceived here, we
    // detect it by noticing that its values are equal to those already
    // installed in the drawonable, and throw it away.
    //
    // A Good ConfigureNotify handler should respond to the event
    // not by moving the window again, but by just setting its internal
    // state to correspond to where the window was moved to.  The window
    // manager doesn't have to put the window where you request, or make
    // it the correct size.  It tells you where it put it through a
    // ConfigureNotify event.  If you try to force the WM to put it
    // where you want by looking at the configureNotify event to find
    // out where it actually put it, you might get walking windows
    // no matter what you do.
    //
    // Note: Gem specifications dictate that the "left" and "top" of a
    // window is the left and top of its frame (not necessarily its
    // drawable area).  The "width" and "height" of a window is the
    // width and height of its drawable area.
    // Also, things drawn inside the window have their coordinates
    // relative to the drawable area's left and top.
    //
    int x, y, w, h, left, top, width, height, outer_left, outer_top, lb, tb, rb,
        bb;

    // We need to use inquire_window_borders to calculate the correct
    // x and y values, because X windows returns local coordinates
    // in the event, not global coordinates, so they're always (0,0).

    if (draw->Inquire_Window_Borders(lb, tb, rb, bb, outer_left, outer_top)) {
      x = outer_left;
      y = outer_top;
      w = event_return.xconfigure.width;
      h = event_return.xconfigure.height;
      draw->Get_Position(left, top);
      draw->Get_Size(width, height);
      //	 std::cout << "Configure notify: " << (void*)draw <<  " " << w << " " << h << " " << event_return.xany.window <<std::endl;

      // Only generate a Gem configure-notify event if something changed
      if ((x != left) || (y != top) || (w != width) || (h != height)) {
        if (Am_Debug_Print_Input_Events)
          std::cout << "<> Configure Notify, x=" << x << " y=" << y
                    << " width=" << width << " height=" << height
                    << " drawonable=" << draw << std::endl;
        draw->reconfigure(x, y, w, h);
        draw->event_handlers->Configure_Notify(draw, x, y, w, h);
      }
    }
    break;
  }
  case ClientMessage:
    // this is where we get window destroy messages
    // from the window manager.
    {
      // this is speed-inefficient, but it never happens, so who cares.
      Atom wm_delete_window =
          XInternAtom(event_return.xclient.display, "WM_DELETE_WINDOW", False);
      if ((unsigned long)event_return.xclient.data.l[0] != wm_delete_window)
        break;
      // not a delete window client message.
      draw->event_handlers->Destroy_Notify(draw);
    }
    break;
  case SelectionClear:
    // We get this event when we're forced to release our selection.
    // We'll ignore it for now.
    break;
  case SelectionRequest:
    handle_selection_request(event_return, draw);
    break;
  // next all the events we don't expect to occur
  case KeyRelease:
  case FocusIn:
  case FocusOut:
  case KeymapNotify:
  case VisibilityNotify:
  case MapRequest:
  case ConfigureRequest:
  case GravityNotify:
  case ResizeRequest:
  case CirculateNotify:
  case CirculateRequest:
  case PropertyNotify:
  case ColormapNotify:
  case MappingNotify:
    std::cout << "** Received event of unexpected type: "
              << event_names[event_return.type] << std::endl;
  case CreateNotify:
  case GraphicsExpose:
  case NoExpose:
  case SelectionNotify: // we get this here if get_cut_buffer misses it.

    // we do get these events unfortunately, so silently ignore them.
    break;
  } // end switch
}